

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O1

void __thiscall
chrono::ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_>::Update_auxiliary
          (ChConstraintTuple_3vars<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>_> *this,double *g_i
          )

{
  if (this->variables_1->disabled == false) {
    (*this->variables_1->_vptr_ChVariables[4])();
  }
  if (this->variables_2->disabled == false) {
    (*this->variables_2->_vptr_ChVariables[4])();
  }
  if (this->variables_3->disabled == false) {
    (*this->variables_3->_vptr_ChVariables[4])();
  }
  if (this->variables_1->disabled == false) {
    *g_i = (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[0] *
           (this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[0] +
           (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[2] *
           (this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[2] +
           (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[4] *
           (this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[4] +
           (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[1] *
           (this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[1] +
           (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[3] *
           (this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[3] +
           (this->Cq_1).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[5] *
           (this->Eq_1).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[5] + *g_i;
  }
  if (this->variables_2->disabled == false) {
    *g_i = (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[0] *
           (this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[0] +
           (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[2] *
           (this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[2] +
           (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[4] *
           (this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[4] +
           (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[1] *
           (this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[1] +
           (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[3] *
           (this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[3] +
           (this->Cq_2).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[5] *
           (this->Eq_2).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[5] + *g_i;
  }
  if (this->variables_3->disabled == false) {
    *g_i = (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[0] *
           (this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[0] +
           (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[2] *
           (this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[2] +
           (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[4] *
           (this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[4] +
           (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[1] *
           (this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[1] +
           (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[3] *
           (this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[3] +
           (this->Cq_3).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
           m_data.array[5] *
           (this->Eq_3).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
           m_data.array[5] + *g_i;
  }
  return;
}

Assistant:

void Update_auxiliary(double& g_i) {
        // 1- Assuming jacobians are already computed, now compute
        //   the matrices [Eq_a]=[invM_a]*[Cq_a]' and [Eq_b]
        if (variables_1->IsActive()) {
            variables_1->Compute_invMb_v(Eq_1, Cq_1.transpose());
        }
        if (variables_2->IsActive()) {
            variables_2->Compute_invMb_v(Eq_2, Cq_2.transpose());
        }
        if (variables_3->IsActive()) {
            variables_3->Compute_invMb_v(Eq_3, Cq_3.transpose());
        }

        // 2- Compute g_i = [Cq_i]*[invM_i]*[Cq_i]' + cfm_i
        if (variables_1->IsActive()) {
            g_i += Cq_1 * Eq_1;
        }
        if (variables_2->IsActive()) {
            g_i += Cq_2 * Eq_2;
        }
        if (variables_3->IsActive()) {
            g_i += Cq_3 * Eq_3;
        }
    }